

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab9.c
# Opt level: O0

int checkerBig(void)

{
  int iVar1;
  int local_30;
  int local_2c;
  int d_1;
  int d;
  char *message;
  FILE *pFStack_18;
  int i;
  FILE *out;
  
  pFStack_18 = fopen("out.txt","r");
  _d_1 = "PASSED";
  if (pFStack_18 == (FILE *)0x0) {
    printf("can\'t open out.txt\n");
    out._4_4_ = 0xffffffff;
  }
  else {
    message._4_4_ = 0;
    while( true ) {
      if ((4999 < message._4_4_) || (_d_1 = ScanInt((FILE *)pFStack_18,&local_2c), _d_1 != "PASSED")
         ) goto LAB_001037fa;
      if (local_2c != message._4_4_) break;
      message._4_4_ = message._4_4_ + 1;
    }
    printf("wrong output -- ");
    _d_1 = "FAILED";
LAB_001037fa:
    if (_d_1 == "PASSED") {
      message._4_4_ = 0;
      while( true ) {
        if ((4999 < message._4_4_) ||
           (_d_1 = ScanInt((FILE *)pFStack_18,&local_30), _d_1 != "PASSED")) goto LAB_00103870;
        if (local_30 != 5000 - message._4_4_) break;
        message._4_4_ = message._4_4_ + 1;
      }
      printf("wrong output -- ");
      _d_1 = "FAILED";
    }
LAB_00103870:
    if ((_d_1 == "PASSED") && (iVar1 = HaveGarbageAtTheEnd((FILE *)pFStack_18), iVar1 != 0)) {
      _d_1 = "FAILED";
    }
    fclose(pFStack_18);
    printf("%s\n",_d_1);
    out._4_4_ = (uint)(_d_1 == "FAILED");
  }
  testN = testN + 1;
  return out._4_4_;
}

Assistant:

static int checkerBig(void)
{
    FILE *const out = fopen("out.txt", "r");
    int i;
    const char* message = Pass;
    if (!out) {
        printf("can't open out.txt\n");
        testN++;
        return -1;
    }
    for (i = 0; i < 5000; i++) {
        int d;
        message = ScanInt(out, &d);
        if (message != Pass) {
            break;
        }
        if (d != i) {
            printf("wrong output -- ");
            message = Fail;
            break;
        }
    }
    if (message == Pass) {
        for (i = 0; i < 5000; i++) {
            int d;
            message = ScanInt(out, &d);
            if (message != Pass) {
                break;
            }
            if (d != 5000-i) {
                printf("wrong output -- ");
                message = Fail;
                break;
            }
        }
    }
    if (message == Pass && HaveGarbageAtTheEnd(out)) {
        message = Fail;
    }
    fclose(out);
    printf("%s\n", message);
    testN++;
    return message == Fail;
}